

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void check_symmetry(void)

{
  int local_28;
  uint local_24;
  int n_1;
  int m_1;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      if (stack37[k][l] != stack37[l][k]) {
        vrna_message_warning("stacking energies not symmetric");
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      if (stackdH[k][l] != stackdH[l][k]) {
        vrna_message_warning("stacking enthalpies not symmetric");
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (m = 0; m < 5; m = m + 1) {
        for (n = 0; n < 5; n = n + 1) {
          if (int11_37[k][l][m][n] != int11_37[l][k][n][m]) {
            vrna_message_warning
                      ("int11 energies not symmetric (%d,%d,%d,%d) (%d vs. %d)",(ulong)(uint)k,
                       (ulong)(uint)l,(ulong)(uint)m,(ulong)(uint)n,
                       (ulong)(uint)int11_37[k][l][m][n],int11_37[l][k][n][m]);
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (m = 0; m < 5; m = m + 1) {
        for (n = 0; n < 5; n = n + 1) {
          if (int11_dH[k][l][m][n] != int11_dH[l][k][n][m]) {
            vrna_message_warning("int11 enthalpies not symmetric");
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (m = 0; m < 5; m = m + 1) {
        for (n = 0; n < 5; n = n + 1) {
          for (m_1 = 0; m_1 < 5; m_1 = m_1 + 1) {
            for (n_1 = 0; n_1 < 5; n_1 = n_1 + 1) {
              if (int22_37[k][l][m][n][m_1][n_1] != int22_37[l][k][m_1][n_1][m][n]) {
                vrna_message_warning("int22 energies not symmetric");
              }
            }
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (m = 0; m < 5; m = m + 1) {
        for (n = 0; n < 5; n = n + 1) {
          for (local_24 = 0; (int)local_24 < 5; local_24 = local_24 + 1) {
            for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
              if (int22_dH[k][l][m][n][(int)local_24][local_28] !=
                  int22_dH[l][k][(int)local_24][local_28][m][n]) {
                vrna_message_warning
                          ("int22 enthalpies not symmetric: %d %d %d %d %d %d",(ulong)(uint)k,
                           (ulong)(uint)l,(ulong)(uint)m,(ulong)(uint)n,(ulong)local_24,local_28);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

PRIVATE void
check_symmetry(void)
{
  int i, j, k, l;

  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      if (stack37[i][j] != stack37[j][i])
        vrna_message_warning("stacking energies not symmetric");

  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      if (stackdH[i][j] != stackdH[j][i])
        vrna_message_warning("stacking enthalpies not symmetric");

  /* interior 1x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          if (int11_37[i][j][k][l] != int11_37[j][i][l][k])
            vrna_message_warning("int11 energies not symmetric (%d,%d,%d,%d) (%d vs. %d)",
                                 i, j, k, l, int11_37[i][j][k][l], int11_37[j][i][l][k]);

  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          if (int11_dH[i][j][k][l] != int11_dH[j][i][l][k])
            vrna_message_warning("int11 enthalpies not symmetric");

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              if (int22_37[i][j][k][l][m][n] != int22_37[j][i][m][n][k][l])
                vrna_message_warning("int22 energies not symmetric");
        }

  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              if (int22_dH[i][j][k][l][m][n] != int22_dH[j][i][m][n][k][l])
                vrna_message_warning("int22 enthalpies not symmetric: %d %d %d %d %d %d",
                                     i, j, k, l, m, n);
        }
}